

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.cxx
# Opt level: O2

void __thiscall cmFunctionHelperCommand::~cmFunctionHelperCommand(cmFunctionHelperCommand *this)

{
  ~cmFunctionHelperCommand(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

~cmFunctionHelperCommand() {}